

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

void __thiscall obs::signal<void(int)>::operator()(signal<void(int)> *this,int *args)

{
  bool bVar1;
  slot<void_(int)> *this_00;
  iterator __end0;
  iterator __begin0;
  iterator iStack_68;
  iterator local_40;
  
  safe_list<obs::slot<void_(int)>_>::begin
            (&local_40,(safe_list<obs::slot<void_(int)>_> *)(this + 8));
  safe_list<obs::slot<void_(int)>_>::end(&iStack_68,(safe_list<obs::slot<void_(int)>_> *)(this + 8))
  ;
  while( true ) {
    bVar1 = safe_list<obs::slot<void_(int)>_>::iterator::operator!=(&local_40,&iStack_68);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<void_(int)>_>::iterator::operator*(&local_40);
    if (this_00 != (slot<void_(int)> *)0x0) {
      slot<void(int)>::operator()((slot<void(int)> *)this_00,args);
    }
    safe_list<obs::slot<void_(int)>_>::iterator::operator++(&local_40);
  }
  safe_list<obs::slot<void_(int)>_>::iterator::~iterator(&iStack_68);
  safe_list<obs::slot<void_(int)>_>::iterator::~iterator(&local_40);
  return;
}

Assistant:

void operator()(Args2&&...args) {
    for (auto slot : m_slots)
      if (slot)
        (*slot)(std::forward<Args2>(args)...);
  }